

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O0

bool __thiscall tl::CStrT<char>::operator==(CStrT<char> *this,CStrT<char> o)

{
  uint local_2c;
  u32 i;
  CStrT<char> *this_local;
  CStrT<char> o_local;
  
  if (this->_size == o._size) {
    for (local_2c = 0; local_2c < this->_size; local_2c = local_2c + 1) {
      if (this->_str[local_2c] != o._str[local_2c]) {
        return false;
      }
    }
    o_local._str._7_1_ = true;
  }
  else {
    o_local._str._7_1_ = false;
  }
  return o_local._str._7_1_;
}

Assistant:

bool CStrT<CharT>::operator==(CStrT o)const
{
    if(_size != o._size)
        return false;
    for(u32 i=0; i<_size; i++) {
        if(_str[i] != o._str[i])
            return false;
    }
    return true;
}